

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Vec_Int_t * Gia_ManDfsForCrossCut(Gia_Man_t *p,int fReverse)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  Vec_Int_t *vNodes;
  int *piVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  iVar1 = p->nObjs;
  if (0 < (long)iVar1) {
    pGVar3 = p->pObjs;
    lVar8 = 0;
    do {
      *(undefined4 *)((long)&pGVar3->Value + lVar8) = 0;
      lVar8 = lVar8 + 0xc;
    } while ((long)iVar1 * 0xc != lVar8);
  }
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar7;
  if (iVar7 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar7 << 2);
  }
  vNodes->pArray = piVar5;
  Gia_ManIncrementTravId(p);
  pVVar6 = p->vCos;
  uVar2 = pVVar6->nSize;
  uVar9 = (ulong)uVar2;
  if (fReverse == 0) {
    if (0 < (int)uVar2) {
      lVar8 = 0;
      do {
        iVar1 = pVVar6->pArray[lVar8];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00240f39;
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return vNodes;
        }
        pGVar3 = p->pObjs + iVar1;
        if ((~*(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) &
            0x1fffffff1fffffff) != 0) {
          Gia_ManDfsForCrossCut_rec(p,pGVar3,vNodes);
        }
        lVar8 = lVar8 + 1;
        pVVar6 = p->vCos;
      } while (lVar8 < pVVar6->nSize);
    }
  }
  else if (0 < (int)uVar2) {
    do {
      if ((long)p->vCos->nSize < (long)uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCos->pArray[uVar9 - 1];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00240f39:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return vNodes;
      }
      pGVar3 = p->pObjs + iVar1;
      if ((~*(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) &
          0x1fffffff1fffffff) != 0) {
        Gia_ManDfsForCrossCut_rec(p,pGVar3,vNodes);
      }
      bVar4 = 1 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar4);
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_ManDfsForCrossCut( Gia_Man_t * p, int fReverse )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanValue( p );
    vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    if ( fReverse )
    {
        Gia_ManForEachCoReverse( p, pObj, i )
            if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
                Gia_ManDfsForCrossCut_rec( p, pObj, vNodes );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
                Gia_ManDfsForCrossCut_rec( p, pObj, vNodes );
    }
    return vNodes;
}